

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall t_perl_generator::generate_service_rest(t_perl_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_service *ptVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  t_type *ptVar6;
  t_perl_generator *this_00;
  _Alloc_hider _Var7;
  long *plVar8;
  string req;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_if;
  string extends;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  long *local_78;
  allocator local_70 [32];
  string local_50 [8];
  long local_48;
  
  std::__cxx11::string::string(local_50,"",local_70);
  std::__cxx11::string::string((string *)local_70,"",(allocator *)&local_f8);
  ptVar2 = tservice->extends_;
  if (ptVar2 != (t_service *)0x0) {
    (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    std::__cxx11::string::_M_assign(local_50);
    perl_namespace_abi_cxx11_(&local_98,this,(ptVar2->super_t_type).program_);
    std::operator+(&local_b8,"use base qw(",&local_98);
    iVar4 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    std::operator+(&local_d8,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar4));
    std::operator+(&local_f8,&local_d8,"Rest);");
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  os = &this->f_service_;
  poVar5 = std::operator<<((ostream *)os,"package ");
  perl_namespace_abi_cxx11_(&local_f8,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar5 = std::operator<<(poVar5,(string *)&local_f8);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar5 = std::operator<<(poVar5,"Rest;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"use strict;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_70);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  if (local_48 == 0) {
    poVar5 = std::operator<<((ostream *)os,"sub new {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_f8);
    poVar5 = std::operator<<(poVar5,"my ($classname, $impl) = @_;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_d8);
    poVar5 = std::operator<<(poVar5,"my $self     ={ impl => $impl };");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_b8);
    poVar5 = std::operator<<(poVar5,"return bless($self,$classname);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = std::operator<<((ostream *)os,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_98,&tservice->functions_)
  ;
  _Var7._M_p = local_98._M_dataplus._M_p;
  while (_Var7._M_p != (pointer)local_98._M_string_length) {
    poVar5 = std::operator<<((ostream *)os,"sub ");
    poVar5 = std::operator<<(poVar5,(string *)(*(long *)_Var7._M_p + 0x68));
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_f8);
    poVar5 = std::operator<<(poVar5,"my ($self, $request) = @_;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f8);
    lVar3 = *(long *)(*(long *)_Var7._M_p + 0x88);
    local_78 = (long *)_Var7._M_p;
    for (plVar8 = *(long **)(lVar3 + 0x88); plVar8 != *(long **)(lVar3 + 0x90); plVar8 = plVar8 + 1)
    {
      ptVar6 = t_type::get_true_type(*(t_type **)(*plVar8 + 0x60));
      std::operator+(&local_d8,"$request->{\'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*plVar8 + 0x68));
      std::operator+(&local_f8,&local_d8,"\'}");
      std::__cxx11::string::~string((string *)&local_d8);
      t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&local_d8);
      poVar5 = std::operator<<(poVar5,"my $");
      poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
      poVar5 = std::operator<<(poVar5," = (");
      poVar5 = std::operator<<(poVar5,(string *)&local_f8);
      poVar5 = std::operator<<(poVar5,") ? ");
      poVar5 = std::operator<<(poVar5,(string *)&local_f8);
      poVar5 = std::operator<<(poVar5," : undef;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_d8);
      iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[6])(ptVar6);
      if ((((char)iVar4 != '\0') &&
          (*(char *)((long)&ptVar6[1].super_t_doc._vptr_t_doc + 4) == '\x01')) &&
         (*(int *)&ptVar6[1].super_t_doc._vptr_t_doc == 1)) {
        t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)os,(string *)&local_d8);
        poVar5 = std::operator<<(poVar5,"my @");
        poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
        poVar5 = std::operator<<(poVar5," = split(/,/, $");
        poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
        poVar5 = std::operator<<(poVar5,");");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_b8);
        poVar5 = std::operator<<(poVar5,"$");
        poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
        poVar5 = std::operator<<(poVar5," = \\@");
        poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::__cxx11::string::~string((string *)&local_f8);
    }
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_f8);
    plVar8 = local_78;
    poVar5 = std::operator<<(poVar5,"return $self->{impl}->");
    poVar5 = std::operator<<(poVar5,(string *)(*plVar8 + 0x68));
    this_00 = (t_perl_generator *)0x2f5ea1;
    poVar5 = std::operator<<(poVar5,"(");
    argument_list_abi_cxx11_(&local_d8,this_00,*(t_struct **)(*plVar8 + 0x88));
    poVar5 = std::operator<<(poVar5,(string *)&local_d8);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    _Var7._M_p = (pointer)(plVar8 + 1);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            ((_Vector_base<t_function_*,_std::allocator<t_function_*>_> *)&local_98);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void t_perl_generator::generate_service_rest(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = extends_s->get_name();
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "Rest);";
  }
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Rest;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $impl) = @_;" << endl << indent()
               << "my $self     ={ impl => $impl };" << endl << endl << indent()
               << "return bless($self,$classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << (*f_iter)->get_name() << "{" << endl;

    indent_up();

    f_service_ << indent() << "my ($self, $request) = @_;" << endl << endl;

    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string req = "$request->{'" + (*a_iter)->get_name() + "'}";
      f_service_ << indent() << "my $" << (*a_iter)->get_name() << " = (" << req << ") ? " << req
                 << " : undef;" << endl;
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_ << indent() << "my @" << (*a_iter)->get_name() << " = split(/,/, $"
                   << (*a_iter)->get_name() << ");" << endl << indent() << "$"
                   << (*a_iter)->get_name() << " = \\@" << (*a_iter)->get_name() << endl;
      }
    }
    f_service_ << indent() << "return $self->{impl}->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist()) << ");" << endl;
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }
}